

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayTex3DValidation.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayTex3DValidation::createTexture(TextureCubeMapArrayTex3DValidation *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayTex3DValidation.cpp"
                  ,0xe5);
  (**(code **)(lVar3 + 0xb8))(0x9009,this->m_to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,
                  "Error binding the texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT texture target!"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayTex3DValidation.cpp"
                  ,0xe9);
  return;
}

Assistant:

void TextureCubeMapArrayTex3DValidation::createTexture()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"Error binding the texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT texture target!");
}